

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterSmallMemory
          (StandardBufferManager *this,MemoryTag tag,idx_t size)

{
  atomic<long> *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1;
  type args_1_00;
  StringUtil *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  StandardBufferManager *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar3;
  undefined6 uStack_88;
  MemoryTag tag_local;
  undefined1 local_81;
  long *local_80;
  long *local_78;
  idx_t size_local;
  TempBufferPoolReservation reservation;
  string local_50;
  
  this_00 = (StandardBufferManager *)CONCAT71(in_register_00000031,tag);
  tag_local = (MemoryTag)size;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,in_RCX,0x400,(idx_t)in_RCX);
  args_1._M_string_length = 0x15862e4;
  args_1._M_dataplus._M_p = (pointer)&local_50;
  args_1.field_2._M_allocated_capacity._0_6_ = uStack_88;
  args_1.field_2._M_local_buf[6] = tag_local;
  args_1.field_2._M_local_buf[7] = local_81;
  args_1.field_2._8_8_ = local_80;
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&reservation,this_00,(MemoryTag)size,(idx_t)in_RCX,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
             "could not allocate block of size %s%s",args_1);
  ::std::__cxx11::string::~string((string *)&local_50);
  local_80 = (long *)0x0;
  (*(this_00->super_BufferManager)._vptr_BufferManager[0x1e])(&local_78,this_00);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  args_1_00 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator*(&this_00->temp_block_manager);
  LOCK();
  paVar1 = &this_00->temporary_id;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_80 = (long *)(lVar2 + 1);
  local_81 = 0;
  make_shared_ptr<duckdb::BlockHandle,duckdb::BlockManager&,long,duckdb::MemoryTag&,duckdb::unique_ptr<duckdb::FileBuffer,std::default_delete<duckdb::FileBuffer>,true>,duckdb::DestroyBufferUpon,unsigned_long_const&,duckdb::TempBufferPoolReservation>
            ((BlockManager *)this,(long *)args_1_00,(MemoryTag *)&local_80,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             &tag_local,(DestroyBufferUpon *)&local_78,(unsigned_long *)&local_81,
             (TempBufferPoolReservation *)&size_local);
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 8))();
  }
  TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterSmallMemory(MemoryTag tag, const idx_t size) {
	D_ASSERT(size < GetBlockSize());
	auto reservation = EvictBlocksOrThrow(tag, size, nullptr, "could not allocate block of size %s%s",
	                                      StringUtil::BytesToHumanReadableString(size));

	auto buffer = ConstructManagedBuffer(size, DEFAULT_BLOCK_HEADER_STORAGE_SIZE, nullptr, FileBufferType::TINY_BUFFER);

	// Create a new block pointer for this block.
	auto result = make_shared_ptr<BlockHandle>(*temp_block_manager, ++temporary_id, tag, std::move(buffer),
	                                           DestroyBufferUpon::BLOCK, size, std::move(reservation));
#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*result);
#endif
	return result;
}